

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O3

void __thiscall polyscope::render::Engine::allocateGlobalBuffersAndPrograms(Engine *this)

{
  pointer pvVar1;
  undefined8 uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  element_type *peVar5;
  long *plVar6;
  undefined8 uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  char *pcVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  shared_ptr<polyscope::render::RenderBuffer> sceneColorAlt;
  shared_ptr<polyscope::render::RenderBuffer> sceneDepthAlt;
  undefined1 local_208 [32];
  element_type *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  element_type *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  element_type *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1a0;
  pointer local_198;
  pointer pbStack_190;
  element_type *local_188;
  pointer pvStack_180;
  element_type *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_170;
  element_type *local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_160;
  element_type *local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_150;
  element_type *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (*this->_vptr_Engine[0x1f])(local_208,this,4,(ulong)view::bufferWidth,(ulong)view::bufferHeight,0)
  ;
  uVar7 = local_208._8_8_;
  uVar2 = local_208._0_8_;
  local_208._0_8_ = (element_type *)0x0;
  local_208._8_8_ = (pointer)0x0;
  p_Var3 = (this->sceneColor).
           super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->sceneColor).
  super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->sceneColor).
  super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((pointer)local_208._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
  }
  (*this->_vptr_Engine[0x1f])(local_208,this,9,(ulong)view::bufferWidth,(ulong)view::bufferHeight,0)
  ;
  uVar7 = local_208._8_8_;
  uVar2 = local_208._0_8_;
  local_208._0_8_ = (element_type *)0x0;
  local_208._8_8_ = (pointer)0x0;
  p_Var3 = (this->sceneDepth).
           super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->sceneDepth).
  super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->sceneDepth).
  super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((pointer)local_208._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
  }
  (*this->_vptr_Engine[0x22])(local_208,this,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  uVar7 = local_208._8_8_;
  uVar2 = local_208._0_8_;
  local_208._0_8_ = (element_type *)0x0;
  local_208._8_8_ = (pointer)0x0;
  p_Var3 = (this->sceneBuffer).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->sceneBuffer).super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)uVar2;
  (this->sceneBuffer).super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((pointer)local_208._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
  }
  local_148 = (this->sceneColor).
              super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  p_Stack_140 = (this->sceneColor).
                super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar4 = (this->sceneBuffer).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->sceneColor).
           super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar4->_vptr_FrameBuffer[6])(peVar4,&local_148);
  if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
  }
  local_158 = (this->sceneDepth).
              super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  p_Stack_150 = (this->sceneDepth).
                super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar4 = (this->sceneBuffer).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->sceneDepth).
           super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar4->_vptr_FrameBuffer[8])(peVar4,&local_158);
  if (p_Stack_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_150);
  }
  (*((this->sceneBuffer).
     super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_FrameBuffer[9])();
  auVar10._8_4_ = 0x3f800000;
  auVar10._0_8_ = 0x3f8000003f800000;
  auVar10._12_4_ = 0x3f800000;
  peVar4 = (this->sceneBuffer).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar2 = vmovlps_avx(auVar10);
  (peVar4->clearColor).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar2;
  (peVar4->clearColor).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar2 >> 0x20);
  (peVar4->clearColor).field_2.z = 1.0;
  ((this->sceneBuffer).
   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  clearAlpha = 0.0;
  (*this->_vptr_Engine[0x1f])(local_208,this,9,(ulong)view::bufferWidth,(ulong)view::bufferHeight,0)
  ;
  uVar7 = local_208._8_8_;
  uVar2 = local_208._0_8_;
  local_208._0_8_ = (element_type *)0x0;
  local_208._8_8_ = (pointer)0x0;
  p_Var3 = (this->sceneDepthMin).
           super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->sceneDepthMin).
  super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->sceneDepthMin).
  super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((pointer)local_208._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
  }
  (*this->_vptr_Engine[0x22])(local_208,this,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  uVar7 = local_208._8_8_;
  uVar2 = local_208._0_8_;
  local_208._0_8_ = (element_type *)0x0;
  local_208._8_8_ = (pointer)0x0;
  p_Var3 = (this->sceneDepthMinFrame).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->sceneDepthMinFrame).
  super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->sceneDepthMinFrame).
  super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((pointer)local_208._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
  }
  local_168 = (this->sceneDepthMin).
              super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  p_Stack_160 = (this->sceneDepthMin).
                super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar4 = (this->sceneDepthMinFrame).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->sceneDepthMin).
           super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar4->_vptr_FrameBuffer[8])(peVar4,&local_168);
  if (p_Stack_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_160);
  }
  ((this->sceneDepthMinFrame).
   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  clearDepth = 0.0;
  (*this->_vptr_Engine[0x1f])(local_208,this,4,(ulong)view::bufferWidth,(ulong)view::bufferHeight,0)
  ;
  uVar7 = local_208._8_8_;
  uVar2 = local_208._0_8_;
  local_208._0_8_ = (element_type *)0x0;
  local_208._8_8_ = (pointer)0x0;
  p_Var3 = (this->sceneColorFinal).
           super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->sceneColorFinal).
  super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->sceneColorFinal).
  super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((pointer)local_208._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
  }
  (*this->_vptr_Engine[0x22])(local_208,this,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  uVar7 = local_208._8_8_;
  uVar2 = local_208._0_8_;
  local_208._0_8_ = (element_type *)0x0;
  local_208._8_8_ = (pointer)0x0;
  p_Var3 = (this->sceneBufferFinal).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->sceneBufferFinal).
  super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->sceneBufferFinal).
  super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((pointer)local_208._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
  }
  local_178 = (this->sceneColorFinal).
              super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  p_Stack_170 = (this->sceneColorFinal).
                super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar4 = (this->sceneBufferFinal).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->sceneColorFinal).
           super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar4->_vptr_FrameBuffer[6])(peVar4,&local_178);
  if (p_Stack_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_170);
  }
  (*((this->sceneBufferFinal).
     super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_FrameBuffer[9])();
  auVar11._8_4_ = 0x3f800000;
  auVar11._0_8_ = 0x3f8000003f800000;
  auVar11._12_4_ = 0x3f800000;
  peVar4 = (this->sceneBufferFinal).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar2 = vmovlps_avx(auVar11);
  (peVar4->clearColor).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar2;
  (peVar4->clearColor).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar2 >> 0x20);
  (peVar4->clearColor).field_2.z = 1.0;
  ((this->sceneBufferFinal).
   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  clearAlpha = 0.0;
  (*this->_vptr_Engine[0x21])(local_208,this,1,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  (*this->_vptr_Engine[0x21])(&local_1d8,this,2,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  (*this->_vptr_Engine[0x22])(&local_1e8,this,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  p_Var8 = p_Stack_1e0;
  peVar4 = local_1e8;
  local_1e8 = (element_type *)0x0;
  p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->displayBufferAlt).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->displayBufferAlt).
  super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (this->displayBufferAlt).
  super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var8;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
    }
  }
  peVar4 = (this->displayBufferAlt).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188 = (element_type *)local_208._0_8_;
  pvStack_180 = (pointer)local_208._8_8_;
  if ((pointer)local_208._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)(local_208._8_8_ + 8) =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
           (*(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)(local_208._8_8_ + 8)
           + 1);
      UNLOCK();
    }
    else {
      *(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)(local_208._8_8_ + 8) =
           (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)
           (*(anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 *)(local_208._8_8_ + 8)
           + 1);
    }
  }
  (*peVar4->_vptr_FrameBuffer[5])(peVar4,&local_188);
  if (pvStack_180 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pvStack_180);
  }
  peVar4 = (this->displayBufferAlt).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_198 = local_1d8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  pbStack_190 = local_1d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_1d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length =
           (int)(local_1d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_1d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length =
           (int)(local_1d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_string_length + 1;
    }
  }
  (*peVar4->_vptr_FrameBuffer[7])(peVar4,&local_198);
  if (pbStack_190 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbStack_190);
  }
  (*((this->displayBufferAlt).
     super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_FrameBuffer[9])();
  auVar12._8_4_ = 0x3f800000;
  auVar12._0_8_ = 0x3f8000003f800000;
  auVar12._12_4_ = 0x3f800000;
  peVar4 = (this->displayBufferAlt).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar2 = vmovlps_avx(auVar12);
  (peVar4->clearColor).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar2;
  (peVar4->clearColor).field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar2 >> 0x20);
  (peVar4->clearColor).field_2.z = 1.0;
  ((this->displayBufferAlt).
   super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  clearAlpha = 0.0;
  if (local_1d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_1d8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((pointer)local_208._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
  }
  (*this->_vptr_Engine[0x21])(local_208,this,3,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  uVar7 = local_208._8_8_;
  uVar2 = local_208._0_8_;
  local_208._0_8_ = (element_type *)0x0;
  local_208._8_8_ = (pointer)0x0;
  p_Var3 = (this->pickColorBuffer).
           super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->pickColorBuffer).
  super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->pickColorBuffer).
  super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((pointer)local_208._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
  }
  (*this->_vptr_Engine[0x21])(local_208,this,2,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  uVar7 = local_208._8_8_;
  uVar2 = local_208._0_8_;
  local_208._0_8_ = (element_type *)0x0;
  local_208._8_8_ = (pointer)0x0;
  p_Var3 = (this->pickDepthBuffer).
           super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->pickDepthBuffer).
  super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->pickDepthBuffer).
  super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((pointer)local_208._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
  }
  (*this->_vptr_Engine[0x22])(local_208,this,(ulong)view::bufferWidth,(ulong)view::bufferHeight);
  uVar7 = local_208._8_8_;
  uVar2 = local_208._0_8_;
  local_208._0_8_ = (pointer)0x0;
  local_208._8_8_ = (pointer)0x0;
  p_Var3 = (this->pickFramebuffer).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->pickFramebuffer).
  super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->pickFramebuffer).
  super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if ((pointer)local_208._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_208._8_8_);
    }
  }
  local_1a8 = (this->pickColorBuffer).
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  p_Stack_1a0 = (this->pickColorBuffer).
                super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar4 = (this->pickFramebuffer).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->pickColorBuffer).
           super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar4->_vptr_FrameBuffer[5])(peVar4,&local_1a8);
  if (p_Stack_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1a0);
  }
  local_1b8 = (this->pickDepthBuffer).
              super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  p_Stack_1b0 = (this->pickDepthBuffer).
                super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  peVar4 = (this->pickFramebuffer).
           super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (this->pickDepthBuffer).
           super___shared_ptr<polyscope::render::RenderBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  (*peVar4->_vptr_FrameBuffer[7])(peVar4,&local_1b8);
  if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
  }
  (*((this->pickFramebuffer).
     super___shared_ptr<polyscope::render::FrameBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_FrameBuffer[9])();
  (*this->_vptr_Engine[0x11])(this,1);
  plVar6 = engine;
  pvVar1 = (pointer)(local_208 + 0x10);
  local_208._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"TEXTURE_DRAW_PLAIN","");
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar6 + 0x118))(&local_1e8,plVar6,local_208,&local_1d8,2);
  p_Var8 = p_Stack_1e0;
  peVar4 = local_1e8;
  local_1e8 = (element_type *)0x0;
  p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->renderTexturePlain).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->renderTexturePlain).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)peVar4;
  (this->renderTexturePlain).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var8;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  if ((pointer)local_208._0_8_ != pvVar1) {
    operator_delete((void *)local_208._0_8_);
  }
  peVar5 = (this->renderTexturePlain).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar9 = "a_position";
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"a_position","");
  screenTrianglesCoords
            ((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)local_208,(Engine *)pcVar9);
  (*peVar5->_vptr_ShaderProgram[0x10])(peVar5,local_90,local_208,0,0,0xffffffff);
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  plVar6 = engine;
  local_208._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"TEXTURE_DRAW_DOT3","");
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar6 + 0x118))(&local_1e8,plVar6,local_208,&local_1d8,2);
  p_Var8 = p_Stack_1e0;
  peVar4 = local_1e8;
  local_1e8 = (element_type *)0x0;
  p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->renderTextureDot3).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->renderTextureDot3).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)peVar4;
  (this->renderTextureDot3).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var8;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  if ((pointer)local_208._0_8_ != pvVar1) {
    operator_delete((void *)local_208._0_8_);
  }
  peVar5 = (this->renderTextureDot3).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar9 = "a_position";
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"a_position","");
  screenTrianglesCoords
            ((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)local_208,(Engine *)pcVar9);
  (*peVar5->_vptr_ShaderProgram[0x10])(peVar5,local_b0,local_208,0,0,0xffffffff);
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  plVar6 = engine;
  local_208._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"TEXTURE_DRAW_MAP3","");
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar6 + 0x118))(&local_1e8,plVar6,local_208,&local_1d8,2);
  p_Var8 = p_Stack_1e0;
  peVar4 = local_1e8;
  local_1e8 = (element_type *)0x0;
  p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->renderTextureMap3).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->renderTextureMap3).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)peVar4;
  (this->renderTextureMap3).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var8;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  if ((pointer)local_208._0_8_ != pvVar1) {
    operator_delete((void *)local_208._0_8_);
  }
  peVar5 = (this->renderTextureMap3).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar9 = "a_position";
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"a_position","");
  screenTrianglesCoords
            ((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)local_208,(Engine *)pcVar9);
  (*peVar5->_vptr_ShaderProgram[0x10])(peVar5,local_d0,local_208,0,0,0xffffffff);
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0]);
  }
  plVar6 = engine;
  local_208._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"TEXTURE_DRAW_SPHEREBG","");
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar6 + 0x118))(&local_1e8,plVar6,local_208,&local_1d8,2);
  p_Var8 = p_Stack_1e0;
  peVar4 = local_1e8;
  local_1e8 = (element_type *)0x0;
  p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->renderTextureSphereBG).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->renderTextureSphereBG).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)peVar4;
  (this->renderTextureSphereBG).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var8;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  if ((pointer)local_208._0_8_ != pvVar1) {
    operator_delete((void *)local_208._0_8_);
  }
  peVar5 = (this->renderTextureSphereBG).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar9 = "a_position";
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"a_position","");
  distantCubeCoords((vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                     *)local_208,(Engine *)pcVar9);
  (*peVar5->_vptr_ShaderProgram[0x11])(peVar5,local_f0,local_208,0,0,0xffffffff);
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  plVar6 = engine;
  local_208._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"COMPOSITE_PEEL","");
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar6 + 0x118))(&local_1e8,plVar6,local_208,&local_1d8,2);
  p_Var8 = p_Stack_1e0;
  peVar4 = local_1e8;
  local_1e8 = (element_type *)0x0;
  p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->compositePeel).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->compositePeel).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)peVar4;
  (this->compositePeel).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var8;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  if ((pointer)local_208._0_8_ != pvVar1) {
    operator_delete((void *)local_208._0_8_);
  }
  peVar5 = (this->compositePeel).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar9 = "a_position";
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"a_position","");
  screenTrianglesCoords
            ((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)local_208,(Engine *)pcVar9);
  (*peVar5->_vptr_ShaderProgram[0x10])(peVar5,local_110,local_208,0,0,0xffffffff);
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_);
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0]);
  }
  peVar5 = (this->compositePeel).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"t_image","");
  (*peVar5->_vptr_ShaderProgram[0x1a])
            (peVar5,(string *)local_50,
             (this->sceneColor).
             super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  plVar6 = engine;
  local_208._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"DEPTH_COPY","");
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*plVar6 + 0x118))(&local_1e8,plVar6,local_208,&local_1d8,2);
  p_Var8 = p_Stack_1e0;
  peVar4 = local_1e8;
  local_1e8 = (element_type *)0x0;
  p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var3 = (this->copyDepth).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->copyDepth).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)peVar4;
  (this->copyDepth).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var8;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  if ((pointer)local_208._0_8_ != pvVar1) {
    operator_delete((void *)local_208._0_8_);
  }
  peVar5 = (this->copyDepth).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar9 = "a_position";
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"a_position","");
  screenTrianglesCoords
            ((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)local_208,(Engine *)pcVar9);
  (*peVar5->_vptr_ShaderProgram[0x10])(peVar5,local_130,local_208,0,0,0xffffffff);
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0]);
  }
  peVar5 = (this->copyDepth).
           super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"t_depth","");
  (*peVar5->_vptr_ShaderProgram[0x1a])
            (peVar5,(string *)local_70,
             (this->sceneDepth).
             super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  loadDefaultMaterials(this);
  loadDefaultColorMaps(this);
  return;
}

Assistant:

void Engine::allocateGlobalBuffersAndPrograms() {

  // Note: The display frame buffer should be manually wrapped by child classes

  { // Scene buffer

    // Note that this is basically duplicated in ground_plane.cpp, changes here should probably be reflected there
    sceneColor = generateTextureBuffer(TextureFormat::RGBA16F, view::bufferWidth, view::bufferHeight);
    // sceneDepth = generateRenderBuffer(RenderBufferType::Depth, view::bufferWidth, view::bufferHeight);
    sceneDepth = generateTextureBuffer(TextureFormat::DEPTH24, view::bufferWidth, view::bufferHeight);

    sceneBuffer = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    sceneBuffer->addColorBuffer(sceneColor);
    sceneBuffer->addDepthBuffer(sceneDepth);
    sceneBuffer->setDrawBuffers();

    sceneBuffer->clearColor = glm::vec3{1., 1., 1.};
    sceneBuffer->clearAlpha = 0.0;
  }

  { // Alternate depth texture used for some effects
    sceneDepthMin = generateTextureBuffer(TextureFormat::DEPTH24, view::bufferWidth, view::bufferHeight);

    sceneDepthMinFrame = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    sceneDepthMinFrame->addDepthBuffer(sceneDepthMin);
    sceneDepthMinFrame->clearDepth = 0.0;
  }

  { // "Final" scene buffer (after resolving)
    sceneColorFinal = generateTextureBuffer(TextureFormat::RGBA16F, view::bufferWidth, view::bufferHeight);

    sceneBufferFinal = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    sceneBufferFinal->addColorBuffer(sceneColorFinal);
    sceneBufferFinal->setDrawBuffers();

    sceneBufferFinal->clearColor = glm::vec3{1., 1., 1.};
    sceneBufferFinal->clearAlpha = 0.0;
  }

  { // Alternate display buffer
    std::shared_ptr<RenderBuffer> sceneColorAlt =
        generateRenderBuffer(RenderBufferType::ColorAlpha, view::bufferWidth, view::bufferHeight);
    std::shared_ptr<RenderBuffer> sceneDepthAlt =
        generateRenderBuffer(RenderBufferType::Depth, view::bufferWidth, view::bufferHeight);

    displayBufferAlt = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    displayBufferAlt->addColorBuffer(sceneColorAlt);
    displayBufferAlt->addDepthBuffer(sceneDepthAlt);
    displayBufferAlt->setDrawBuffers();

    displayBufferAlt->clearColor = glm::vec3{1., 1., 1.};
    displayBufferAlt->clearAlpha = 0.0;
  }

  { // Pick buffer
    pickColorBuffer = generateRenderBuffer(RenderBufferType::Float4, view::bufferWidth, view::bufferHeight);
    pickDepthBuffer = generateRenderBuffer(RenderBufferType::Depth, view::bufferWidth, view::bufferHeight);

    pickFramebuffer = generateFrameBuffer(view::bufferWidth, view::bufferHeight);
    pickFramebuffer->addColorBuffer(pickColorBuffer);
    pickFramebuffer->addDepthBuffer(pickDepthBuffer);
    pickFramebuffer->setDrawBuffers();
  }

  // Make sure all the buffer sizes are up to date
  updateWindowSize(true);

  { // Generate the general-use programs
    // clang-format off
    renderTexturePlain = render::engine->requestShader("TEXTURE_DRAW_PLAIN", {}, render::ShaderReplacementDefaults::Process);
    renderTexturePlain->setAttribute("a_position", screenTrianglesCoords());

    renderTextureDot3 = render::engine->requestShader("TEXTURE_DRAW_DOT3", {}, render::ShaderReplacementDefaults::Process);
    renderTextureDot3->setAttribute("a_position", screenTrianglesCoords());

    renderTextureMap3 = render::engine->requestShader("TEXTURE_DRAW_MAP3", {}, render::ShaderReplacementDefaults::Process);
    renderTextureMap3->setAttribute("a_position", screenTrianglesCoords());

    renderTextureSphereBG = render::engine->requestShader("TEXTURE_DRAW_SPHEREBG", {}, render::ShaderReplacementDefaults::Process);
    renderTextureSphereBG->setAttribute("a_position", distantCubeCoords());

    compositePeel = render::engine->requestShader("COMPOSITE_PEEL", {}, render::ShaderReplacementDefaults::Process);
    compositePeel->setAttribute("a_position", screenTrianglesCoords());
    compositePeel->setTextureFromBuffer("t_image", sceneColor.get());

    copyDepth = render::engine->requestShader("DEPTH_COPY", {}, render::ShaderReplacementDefaults::Process);
    copyDepth->setAttribute("a_position", screenTrianglesCoords());
    copyDepth->setTextureFromBuffer("t_depth", sceneDepth.get());
    // clang-format on
  }

  { // Load defaults
    loadDefaultMaterials();
    loadDefaultColorMaps();
  }
}